

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O2

void __thiscall
OpticsParser::Parser::parseStringPropertyInsideBraces<std::__cxx11::string>
          (Parser *this,string *line,string *search,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *property)

{
  _Alloc_hider __position;
  int iVar1;
  size_type sVar2;
  string str;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (search,":");
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,search,0);
  if (sVar2 == 0xffffffffffffffff) {
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&str,line,sVar2 + search->_M_string_length + 1,0xffffffffffffffff);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&str,'}',0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (&str,sVar2,1);
  while ((sVar2 = str._M_string_length, __position._M_p = str._M_dataplus._M_p,
         str._M_string_length != 0 && (iVar1 = isspace((int)*str._M_dataplus._M_p), iVar1 != 0))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&str,(__const_iterator)__position._M_p);
  }
  while ((sVar2 != 0 && (iVar1 = isspace((int)str._M_dataplus._M_p[sVar2 - 1]), iVar1 != 0))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(&str);
    sVar2 = str._M_string_length;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (property,&str);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void parseStringPropertyInsideBraces(const std::string & line,
			std::string search,
			T & property)
		{
			search += ":";
			auto itr = line.find(search);
			if(itr != std::string::npos)
			{
				std::string str = line.substr(itr + search.size() + 1);
				auto erasePos = str.find('}');
				str.erase(erasePos, 1);
				// Removes all spaces from the beginning of the string
				while(str.size() && isspace(str.front()))
					str.erase(str.begin());
				// Remove all spaces from the end of the string.
				while(str.size() && isspace(str.back()))
					str.pop_back();
				property = str;
			}
		}